

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback_queue.cpp
# Opt level: O2

bool __thiscall miniros::CallbackQueue::isEnabled(CallbackQueue *this)

{
  bool bVar1;
  
  std::mutex::lock(&this->mutex_);
  bVar1 = this->enabled_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return bVar1;
}

Assistant:

bool CallbackQueue::isEnabled()
{
  std::scoped_lock<std::mutex> lock(mutex_);

  return enabled_;
}